

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,formatv_object_base *Obj)

{
  undefined1 local_a8 [8];
  SmallString<128U> S;
  formatv_object_base *Obj_local;
  raw_ostream *this_local;
  
  S.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_ = Obj;
  SmallString<128U>::SmallString((SmallString<128U> *)local_a8);
  formatv_object_base::format
            ((formatv_object_base *)
             S.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts._120_8_
             ,this);
  SmallString<128U>::~SmallString((SmallString<128U> *)local_a8);
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const formatv_object_base &Obj) {
  SmallString<128> S;
  Obj.format(*this);
  return *this;
}